

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O0

void __thiscall Vector4f::Vector4f(Vector4f *this,Vector2f *xy,float z,float w)

{
  Vector2f *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  
  fVar1 = Vector2f::x(in_RSI);
  *in_RDI = fVar1;
  fVar1 = Vector2f::y(in_RSI);
  in_RDI[1] = fVar1;
  in_RDI[2] = in_XMM0_Da;
  in_RDI[3] = in_XMM1_Da;
  return;
}

Assistant:

Vector4f::Vector4f( const Vector2f& xy, float z, float w )
{
	m_elements[0] = xy.x();
	m_elements[1] = xy.y();
	m_elements[2] = z;
	m_elements[3] = w;
}